

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_bool32 drwav_init(drwav *pWav,drwav_read_proc onRead,drwav_seek_proc onSeek,void *pUserData)

{
  drwav_uint64 *pRunningBytesReadOut;
  long lVar1;
  long lVar2;
  drwav_uint16 dVar3;
  drwav_uint16 dVar4;
  drwav_uint16 dVar5;
  drwav_uint16 dVar6;
  drwav_bool32 dVar7;
  undefined4 uVar8;
  size_t sVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  drwav_uint64 dVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  uchar riff [4];
  drwav_container *local_d0;
  drwav_uint64 sampleCountFromFactChunk;
  drwav_uint32 local_c0;
  drwav_uint32 sampleCount;
  uchar wave [4];
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 local_ac;
  ulong local_a8;
  uint local_a0;
  drwav_fmt fmt;
  uchar uStack_56;
  uchar uStack_55;
  
  if (onSeek != (drwav_seek_proc)0x0 && onRead != (drwav_read_proc)0x0) {
    memset(pWav,0,0x150);
    sVar9 = (*onRead)(pUserData,riff,4);
    if (sVar9 == 4) {
      if (riff[0] == 'r') {
        if (riff[1] != 'i') {
          return 0;
        }
        if (riff[2] != 'f') {
          return 0;
        }
        if (riff[3] != 'f') {
          return 0;
        }
        pWav->container = drwav_container_w64;
        sVar9 = (*onRead)(pUserData,&fmt,0xc);
        if (sVar9 != 0xc) {
          return 0;
        }
        lVar11 = 0;
        do {
          if (lVar11 == 0xc) {
            if (pWav->container == drwav_container_riff) goto LAB_00109d03;
            sVar9 = (*onRead)(pUserData,wave,8);
            if (sVar9 != 8) {
              return 0;
            }
            if (CONCAT44(uStack_b4,wave) < 0x50) {
              return 0;
            }
            sVar9 = (*onRead)(pUserData,&fmt,0x10);
            if (sVar9 != 0x10) {
              return 0;
            }
            auVar15._0_4_ = -(uint)(CONCAT22(fmt.channels,fmt.formatTag) == 0x65766177);
            auVar15._4_4_ = -(uint)(fmt.sampleRate == 0x11d3acf3);
            auVar15._8_4_ = -(uint)(fmt.avgBytesPerSec == 0xc000d18c);
            auVar15._12_4_ = -(uint)(CONCAT22(fmt.bitsPerSample,fmt.blockAlign) == -0x752471b1);
            uVar8 = movmskps(0x10,auVar15);
            if ((char)uVar8 != '\x0f') {
              return 0;
            }
            pWav->dataChunkDataPos = 0x28;
            goto LAB_00109d54;
          }
          lVar2 = lVar11 + -0x18;
          lVar1 = lVar11 + 4;
          lVar11 = lVar11 + 1;
        } while (fmt.subFormat[lVar2] == drwavGUID_W64_RIFF[lVar1]);
      }
      else {
        if (riff[0] != 'R') {
          return 0;
        }
        if (riff[1] != 'I') {
          return 0;
        }
        if (riff[2] != 'F') {
          return 0;
        }
        if (riff[3] != 'F') {
          return 0;
        }
        pWav->container = drwav_container_riff;
LAB_00109d03:
        sVar9 = (*onRead)(pUserData,&fmt,4);
        if (sVar9 != 4) {
          return 0;
        }
        if (CONCAT22(fmt.channels,fmt.formatTag) < 0x24) {
          return 0;
        }
        sVar9 = (*onRead)(pUserData,wave,4);
        if (sVar9 != 4) {
          return 0;
        }
        if (wave != (uchar  [4])0x45564157) {
          return 0;
        }
        pWav->dataChunkDataPos = 0xc;
LAB_00109d54:
        local_d0 = &pWav->container;
        pRunningBytesReadOut = &pWav->dataChunkDataPos;
        dVar7 = drwav__read_fmt(onRead,onSeek,pUserData,pWav->container,pRunningBytesReadOut,&fmt);
        dVar5 = fmt.bitsPerSample;
        dVar4 = fmt.blockAlign;
        dVar3 = fmt.channels;
        if (dVar7 == 0) {
          return 0;
        }
        local_c0 = fmt.sampleRate;
        if ((fmt.blockAlign == 0 || fmt.bitsPerSample == 0) ||
            (fmt.channels == 0 || fmt.sampleRate == 0)) {
          return 0;
        }
        uVar12 = (ulong)fmt.channels;
        uVar10 = (ulong)fmt.blockAlign;
        dVar6 = fmt.formatTag;
        if (fmt.formatTag == 0xfffe) {
          dVar6 = fmt.subFormat._0_2_;
        }
        sampleCountFromFactChunk = 0;
        while (dVar7 = drwav__read_chunk_header
                                 (onRead,pUserData,*local_d0,pRunningBytesReadOut,
                                  (drwav__chunk_header *)wave), dVar7 != 0) {
          uVar14 = local_a8;
          if (*local_d0 == drwav_container_riff) {
            if (wave == (uchar  [4])0x61746164) goto LAB_0010a04b;
            if ((((wave[0] == 'f') && (wave[1] == 'a')) && (uStack_56 = wave[2], uStack_56 == 'c'))
               && (uStack_55 = wave[3], uStack_55 == 't')) {
              sVar9 = (*onRead)(pUserData,&sampleCount,4);
              if (sVar9 != 4) {
                return 0;
              }
              pWav->dataChunkDataPos = pWav->dataChunkDataPos + 4;
              uVar14 = local_a8 - 4;
              sampleCountFromFactChunk = (drwav_uint64)sampleCount;
              if (pWav->translatedFormatTag != 2) {
                sampleCountFromFactChunk = 0;
              }
            }
          }
          else {
            if ((wave == (uchar  [4])0x61746164) &&
               (local_ac == -0x752471b1 && (local_b0 == -0x3fff2e74 && uStack_b4 == 0x11d3acf3))) {
LAB_0010a04b:
              pWav->onRead = onRead;
              pWav->onSeek = onSeek;
              pWav->pUserData = pUserData;
              (pWav->fmt).formatTag = fmt.formatTag;
              (pWav->fmt).channels = fmt.channels;
              (pWav->fmt).sampleRate = fmt.sampleRate;
              (pWav->fmt).avgBytesPerSec = fmt.avgBytesPerSec;
              (pWav->fmt).blockAlign = fmt.blockAlign;
              (pWav->fmt).bitsPerSample = fmt.bitsPerSample;
              (pWav->fmt).extendedSize = fmt.extendedSize;
              (pWav->fmt).validBitsPerSample = fmt.validBitsPerSample;
              (pWav->fmt).channelMask = fmt.channelMask;
              *(ulong *)(pWav->fmt).subFormat = CONCAT62(fmt.subFormat._2_6_,fmt.subFormat._0_2_);
              *(undefined8 *)((pWav->fmt).subFormat + 8) = fmt.subFormat._8_8_;
              pWav->sampleRate = local_c0;
              pWav->channels = dVar3;
              pWav->bitsPerSample = dVar5;
              pWav->bytesPerSample = dVar4 / dVar3;
              pWav->bytesRemaining = local_a8;
              pWav->translatedFormatTag = dVar6;
              pWav->dataChunkDataSize = local_a8;
              if (dVar4 < dVar3) {
                return 0;
              }
              if (sampleCountFromFactChunk == 0) {
                pWav->totalSampleCount = local_a8 / (dVar4 / dVar3);
                if (dVar6 == 0x11) {
                  dVar13 = (uVar12 + (long)(int)((uint)dVar4 + (uint)dVar3 * -4) * 2) *
                           (local_a8 / uVar10);
                }
                else {
                  if (dVar6 != 2) {
                    return 1;
                  }
                  dVar13 = (uVar12 * 0x7ffffffffffffffa + uVar10) * (local_a8 / uVar10) * 2;
                }
                pWav->totalSampleCount = dVar13;
                pWav->bytesPerSample = 0;
              }
              else {
                pWav->totalSampleCount = sampleCountFromFactChunk * uVar12;
                if ((dVar6 != 2) && (dVar6 != 0x11)) {
                  return 1;
                }
                pWav->bytesPerSample = 0;
                if ((dVar6 != 0x11) && (dVar6 != 2)) {
                  return 1;
                }
              }
              if (dVar3 < 3) {
                return 1;
              }
              return 0;
            }
            if (local_ac == -0x752471b1 &&
                (local_b0 == -0x3fff2e74 &&
                (uStack_b4 == 0x11d3acf3 && wave == (uchar  [4])0x74636166))) {
              sVar9 = (*onRead)(pUserData,&sampleCountFromFactChunk,8);
              if (sVar9 != 8) {
                return 0;
              }
              *pRunningBytesReadOut = *pRunningBytesReadOut + 4;
              uVar14 = local_a8 - 8;
            }
          }
          drwav__seek_forward(onSeek,local_a0 + uVar14,pUserData);
          *pRunningBytesReadOut = *pRunningBytesReadOut + local_a0 + uVar14;
        }
      }
    }
  }
  return 0;
}

Assistant:

drwav_bool32 drwav_init(drwav* pWav, drwav_read_proc onRead, drwav_seek_proc onSeek, void* pUserData) {
    if (onRead == NULL || onSeek == NULL) {
        return DRWAV_FALSE;
    }

    drwav_zero_memory(pWav, sizeof(*pWav));


    // The first 4 bytes should be the RIFF identifier.
    unsigned char riff[4];
    if (onRead(pUserData, riff, sizeof(riff)) != sizeof(riff)) {
        return DRWAV_FALSE;  // Failed to read data.
    }

    // The first 4 bytes can be used to identify the container. For RIFF files it will start with "RIFF" and for
    // w64 it will start with "riff".
    if (drwav__fourcc_equal(riff, "RIFF")) {
        pWav->container = drwav_container_riff;
    } else if (drwav__fourcc_equal(riff, "riff")) {
        pWav->container = drwav_container_w64;

        // Check the rest of the GUID for validity.
        drwav_uint8 riff2[12];
        if (onRead(pUserData, riff2, sizeof(riff2)) != sizeof(riff2)) {
            return DRWAV_FALSE;
        }

        for (int i = 0; i < 12; ++i) {
            if (riff2[i] != drwavGUID_W64_RIFF[i + 4]) {
                return DRWAV_FALSE;
            }
        }
    } else {
        return DRWAV_FALSE;  // Unknown or unsupported container.
    }


    if (pWav->container == drwav_container_riff) {
        // RIFF/WAVE
        unsigned char chunkSizeBytes[4];
        if (onRead(pUserData, chunkSizeBytes, sizeof(chunkSizeBytes)) != sizeof(chunkSizeBytes)) {
            return DRWAV_FALSE;
        }

        unsigned int chunkSize = drwav__bytes_to_u32(chunkSizeBytes);
        if (chunkSize < 36) {
            return DRWAV_FALSE;  // Chunk size should always be at least 36 bytes.
        }

        unsigned char wave[4];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__fourcc_equal(wave, "WAVE")) {
            return DRWAV_FALSE;  // Expecting "WAVE".
        }

        pWav->dataChunkDataPos = 4 + sizeof(chunkSizeBytes) + sizeof(wave);
    } else {
        // W64
        unsigned char chunkSize[8];
        if (onRead(pUserData, chunkSize, sizeof(chunkSize)) != sizeof(chunkSize)) {
            return DRWAV_FALSE;
        }

        if (drwav__bytes_to_u64(chunkSize) < 80) {
            return DRWAV_FALSE;
        }

        drwav_uint8 wave[16];
        if (onRead(pUserData, wave, sizeof(wave)) != sizeof(wave)) {
            return DRWAV_FALSE;
        }

        if (!drwav__guid_equal(wave, drwavGUID_W64_WAVE)) {
            return DRWAV_FALSE;
        }

        pWav->dataChunkDataPos = 16 + sizeof(chunkSize) + sizeof(wave);
    }


    // The next 24 bytes should be the "fmt " chunk.
    drwav_fmt fmt;
    if (!drwav__read_fmt(onRead, onSeek, pUserData, pWav->container, &pWav->dataChunkDataPos, &fmt)) {
        return DRWAV_FALSE;  // Failed to read the "fmt " chunk.
    }

    // Basic validation.
    if (fmt.sampleRate == 0 || fmt.channels == 0 || fmt.bitsPerSample == 0 || fmt.blockAlign == 0) {
        return DRWAV_FALSE;  // Invalid channel count. Probably an invalid WAV file.
    }


    // Translate the internal format.
    unsigned short translatedFormatTag = fmt.formatTag;
    if (translatedFormatTag == DR_WAVE_FORMAT_EXTENSIBLE) {
        translatedFormatTag = drwav__bytes_to_u16(fmt.subFormat + 0);
    }


    drwav_uint64 sampleCountFromFactChunk = 0;

    // The next chunk we care about is the "data" chunk. This is not necessarily the next chunk so we'll need to loop.
    drwav_uint64 dataSize;
    for (;;) {
        drwav__chunk_header header;
        if (!drwav__read_chunk_header(onRead, pUserData, pWav->container, &pWav->dataChunkDataPos, &header)) {
            return DRWAV_FALSE;
        }

        dataSize = header.sizeInBytes;
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "data")) {
                break;
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_DATA)) {
                break;
            }
        }

        // Optional. Get the total sample count from the FACT chunk. This is useful for compressed formats.
        if (pWav->container == drwav_container_riff) {
            if (drwav__fourcc_equal(header.id.fourcc, "fact")) {
                drwav_uint32 sampleCount;
                if (onRead(pUserData, &sampleCount, 4) != 4) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 4;

                // The sample count in the "fact" chunk is either unreliable, or I'm not understanding it properly. For
                // now I am only enabling this for Microsoft ADPCM formats.
                if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
                    sampleCountFromFactChunk = sampleCount;
                } else {
                    sampleCountFromFactChunk = 0;
                }
            }
        } else {
            if (drwav__guid_equal(header.id.guid, drwavGUID_W64_FACT)) {
                if (onRead(pUserData, &sampleCountFromFactChunk, 8) != 8) {
                    return DRWAV_FALSE;
                }
                pWav->dataChunkDataPos += 4;
                dataSize -= 8;
            }
        }

        // If we get here it means we didn't find the "data" chunk. Seek past it.

        // Make sure we seek past the padding.
        dataSize += header.paddingSize;
        drwav__seek_forward(onSeek, dataSize, pUserData);
        pWav->dataChunkDataPos += dataSize;
    }

    // At this point we should be sitting on the first byte of the raw audio data.

    pWav->onRead = onRead;
    pWav->onSeek = onSeek;
    pWav->pUserData = pUserData;
    pWav->fmt = fmt;
    pWav->sampleRate = fmt.sampleRate;
    pWav->channels = fmt.channels;
    pWav->bitsPerSample = fmt.bitsPerSample;
    pWav->bytesPerSample = fmt.blockAlign / fmt.channels;
    pWav->bytesRemaining = dataSize;
    pWav->translatedFormatTag = translatedFormatTag;
    pWav->dataChunkDataSize = dataSize;

    // The bytes per sample should never be 0 at this point. This would indicate an invalid WAV file.
    if (pWav->bytesPerSample == 0) {
        return DRWAV_FALSE;
    }

    if (sampleCountFromFactChunk != 0) {
        pWav->totalSampleCount = sampleCountFromFactChunk * fmt.channels;
    } else {
        pWav->totalSampleCount = dataSize / pWav->bytesPerSample;

        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
        }
        if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
            drwav_uint64 blockCount = dataSize / fmt.blockAlign;
            pWav->totalSampleCount =
                ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
        }
    }

    // The way we calculate the bytes per sample does not make sense for compressed formats so we just set it to 0.
    if (drwav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        pWav->bytesPerSample = 0;
    }

    // Some formats only support a certain number of channels.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM || pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        if (pWav->channels > 2) {
            return DRWAV_FALSE;
        }
    }

#ifdef DR_WAV_LIBSNDFILE_COMPAT
    // I use libsndfile as a benchmark for testing, however in the version I'm using (from the Windows installer on the
    // libsndfile website), it appears the total sample count libsndfile uses for MS-ADPCM is incorrect. It would seem
    // they are computing the total sample count from the number of blocks, however this results in the inclusion of the
    // extra silent samples at the end of the last block. The correct way to know the total sample count is to inspect
    // the "fact" chunk which should always be present for compressed formats, and should always include the sample
    // count. This little block of code below is only used to emulate the libsndfile logic so I can properly run my
    // correctness tests against libsndfile, and is disabled by default.
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            (blockCount * (fmt.blockAlign - (6 * pWav->channels))) * 2;  // x2 because two samples per byte.
    }
    if (pWav->translatedFormatTag == DR_WAVE_FORMAT_DVI_ADPCM) {
        drwav_uint64 blockCount = dataSize / fmt.blockAlign;
        pWav->totalSampleCount =
            ((blockCount * (fmt.blockAlign - (4 * pWav->channels))) * 2) + (blockCount * pWav->channels);
    }
#endif

    return DRWAV_TRUE;
}